

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void string_suite::test_escape_unicode_89AB(void)

{
  char input [9];
  decoder_type decoder;
  undefined4 local_194;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  value_type local_170 [16];
  basic_decoder<char> local_160;
  
  builtin_memcpy(local_170,"\"\\u89AB\"",9);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<9ul>
            (&local_160,(value_type (*) [9])local_170);
  local_190._M_dataplus._M_p._0_4_ = local_160.current.code;
  local_194 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x68e,"void string_suite::test_escape_unicode_89AB()",&local_190,&local_194);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_190,&local_160);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("decoder.string_value<std::string>()","\"\\u89AB\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x68f,"void string_suite::test_escape_unicode_89AB()",&local_190,anon_var_dwarf_6684);
  std::__cxx11::string::~string((string *)&local_190);
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_190._M_dataplus._M_p._0_4_ = local_160.current.code;
  local_194 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x691,"void string_suite::test_escape_unicode_89AB()",&local_190,&local_194);
  return;
}

Assistant:

void test_escape_unicode_89AB()
{
    const char input[] = "\"\\u89AB\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "\u89AB");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}